

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ
          (ChElementHexaANCF_3813 *this,ShapeVector *Nz,double x,double y,double z)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  
  auVar4._8_8_ = 0x3ff0000000000000;
  auVar4._0_8_ = 0x3ff0000000000000;
  auVar4 = vshufpd_avx(auVar4,auVar4,3);
  dVar1 = (2.0 / (this->m_InertFlexVec).m_data[2]) * 0.125;
  auVar2 = vpermpd_avx2(ZEXT1632(CONCAT88((x + 1.0) * dVar1,(1.0 - x) * dVar1)),0x14);
  auVar3._0_8_ = (1.0 - y) * auVar2._0_8_;
  auVar3._8_8_ = (1.0 - y) * auVar2._8_8_;
  auVar3._16_8_ = (y + auVar4._0_8_) * auVar2._16_8_;
  auVar3._24_8_ = (y + auVar4._8_8_) * auVar2._24_8_;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar2._16_8_ = 0x8000000000000000;
  auVar2._24_8_ = 0x8000000000000000;
  auVar2 = vxorpd_avx512vl(auVar3,auVar2);
  *(undefined1 (*) [32])
   (Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array =
       auVar2;
  *(undefined1 (*) [32])
   ((Nz->super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>).m_storage.m_data.array + 4) =
       auVar3;
  return;
}

Assistant:

void ChElementHexaANCF_3813::ShapeFunctionsDerivativeZ(ShapeVector& Nz, double x, double y, double z) {
    double c = GetLengthZ();

    Nz(0) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 - y) * (-1.0);
    Nz(1) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 - y) * (-1.0);
    Nz(2) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 + y) * (-1.0);
    Nz(3) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 + y) * (-1.0);
    Nz(4) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 - y) * (1.0);
    Nz(5) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 - y) * (1.0);
    Nz(6) = 2.0 / c * 0.125 * (1.0 + x) * (1.0 + y) * (1.0);
    Nz(7) = 2.0 / c * 0.125 * (1.0 - x) * (1.0 + y) * (1.0);
}